

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_until.hpp
# Opt level: O2

void __thiscall
asio::detail::
read_until_delim_string_op<asio::basic_stream_socket<asio::ip::tcp>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::wrapped_handler<asio::io_context::strand,std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>,asio::detail::is_continuation_if_running>>
::read_until_delim_string_op<asio::basic_streambuf_ref<std::allocator<char>>>
          (read_until_delim_string_op<asio::basic_stream_socket<asio::ip::tcp>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::wrapped_handler<asio::io_context::strand,std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>,asio::detail::is_continuation_if_running>>
           *this,basic_stream_socket<asio::ip::tcp> *stream,
          basic_streambuf_ref<std::allocator<char>_> *buffers,string *delim,
          wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>,_asio::detail::is_continuation_if_running>
          *handler)

{
  *(basic_stream_socket<asio::ip::tcp> **)this = stream;
  *(basic_streambuf<std::allocator<char>_> **)(this + 8) = buffers->sb_;
  std::__cxx11::string::string((string *)(this + 0x10),(string *)delim);
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>,_asio::detail::is_continuation_if_running>
  ::wrapped_handler((wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>,_asio::detail::is_continuation_if_running>
                     *)(this + 0x40),handler);
  return;
}

Assistant:

read_until_delim_string_op(AsyncReadStream& stream,
        ASIO_MOVE_ARG(BufferSequence) buffers,
        const std::string& delim, ReadHandler& handler)
      : stream_(stream),
        buffers_(ASIO_MOVE_CAST(BufferSequence)(buffers)),
        delim_(delim),
        start_(0),
        search_position_(0),
        handler_(ASIO_MOVE_CAST(ReadHandler)(handler))
    {
    }